

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O2

bool __thiscall
cmBuildCommand::TwoArgsSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  char *pcVar2;
  cmMakefile *pcVar3;
  bool ignoreErrors;
  char *pcVar4;
  char *pcVar5;
  cmGlobalGenerator *this_00;
  ulong uVar6;
  allocator local_aa;
  allocator local_a9;
  string configType;
  string local_88;
  string makecommand;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar6 < 0x21) {
    std::__cxx11::string::string
              ((string *)&configType,"called with less than two arguments",(allocator *)&makecommand
              );
    cmCommand::SetError(&this->super_cmCommand,&configType);
  }
  else {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    pcVar3 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&configType,pcVar2,(allocator *)&makecommand);
    pcVar4 = cmMakefile::GetDefinition(pcVar3,&configType);
    std::__cxx11::string::~string((string *)&configType);
    std::__cxx11::string::string((string *)&configType,"Release",(allocator *)&makecommand);
    pcVar5 = getenv("CMAKE_CONFIG_TYPE");
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      std::__cxx11::string::assign((char *)&configType);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&local_88,"",&local_a9);
    std::__cxx11::string::string((string *)&local_48,"",&local_aa);
    ignoreErrors = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&makecommand,this_00,&local_88,&configType,&local_48,ignoreErrors);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    if (pcVar4 == (char *)0x0) {
      pcVar3 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_88,pcVar2,(allocator *)&local_48);
      cmMakefile::AddCacheDefinition
                (pcVar3,&local_88,makecommand._M_dataplus._M_p,
                 "Command used to build entire project from the command line.",STRING,false);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)&makecommand);
  }
  std::__cxx11::string::~string((string *)&configType);
  return 0x20 < uVar6;
}

Assistant:

bool cmBuildCommand
::TwoArgsSignature(std::vector<std::string> const& args)
{
  if(args.size() < 2 )
    {
    this->SetError("called with less than two arguments");
    return false;
    }

  const char* define = args[0].c_str();
  const char* cacheValue
    = this->Makefile->GetDefinition(define);

  std::string configType = "Release";
  const char* cfg = getenv("CMAKE_CONFIG_TYPE");
  if ( cfg && *cfg )
    {
    configType = cfg;
    }

  std::string makecommand = this->Makefile->GetGlobalGenerator()
    ->GenerateCMakeBuildCommand("", configType, "",
                                this->Makefile->IgnoreErrorsCMP0061());

  if(cacheValue)
    {
    return true;
    }
  this->Makefile->AddCacheDefinition(define,
                                 makecommand.c_str(),
                                 "Command used to build entire project "
                                 "from the command line.",
                                 cmState::STRING);
  return true;
}